

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastrender.h
# Opt level: O0

void __thiscall
SQCompilation::RenderVisitor::visitGetSlotExpr(RenderVisitor *this,GetSlotExpr *expr)

{
  bool bVar1;
  SlotAccessExpr *in_RSI;
  RenderVisitor *in_RDI;
  Node *unaff_retaddr;
  char c;
  RenderVisitor *visitor;
  
  visitor = in_RDI;
  AccessExpr::receiver(&in_RSI->super_AccessExpr);
  c = (char)((ulong)in_RDI >> 0x38);
  Node::visit<SQCompilation::RenderVisitor>(unaff_retaddr,visitor);
  bVar1 = AccessExpr::isNullable(&in_RSI->super_AccessExpr);
  if (bVar1) {
    OutputStream::writeChar((OutputStream *)in_RSI,c);
  }
  OutputStream::writeChar((OutputStream *)in_RSI,c);
  SlotAccessExpr::key(in_RSI);
  Node::visit<SQCompilation::RenderVisitor>(unaff_retaddr,visitor);
  OutputStream::writeChar((OutputStream *)in_RSI,c);
  return;
}

Assistant:

virtual void visitGetSlotExpr(GetSlotExpr *expr) {
        expr->receiver()->visit(this);
        if (expr->isNullable()) _out->writeChar('?');
        _out->writeChar('[');
        expr->key()->visit(this);
        _out->writeChar(']');
    }